

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O0

void qt_memfill_template<unsigned_short>(unsigned_short *dest,unsigned_short color,qsizetype count)

{
  long lVar1;
  qsizetype n;
  qsizetype count_local;
  unsigned_short color_local;
  unsigned_short *dest_local;
  
  if (count != 0) {
    lVar1 = count + 7;
    if (count + 7 < 0) {
      lVar1 = count + 0xe;
    }
    n = lVar1 >> 3;
    dest_local = dest;
    switch((uint)count & 7) {
    case 0:
      dest_local = dest;
      do {
        *dest_local = color;
        dest_local = dest_local + 1;
switchD_00b7e21d_caseD_7:
        *dest_local = color;
        dest_local = dest_local + 1;
switchD_00b7e21d_caseD_6:
        *dest_local = color;
        dest_local = dest_local + 1;
switchD_00b7e21d_caseD_5:
        *dest_local = color;
        dest_local = dest_local + 1;
switchD_00b7e21d_caseD_4:
        *dest_local = color;
        dest_local = dest_local + 1;
switchD_00b7e21d_caseD_3:
        *dest_local = color;
        dest_local = dest_local + 1;
switchD_00b7e21d_caseD_2:
        *dest_local = color;
        dest_local = dest_local + 1;
switchD_00b7e21d_caseD_1:
        *dest_local = color;
        n = n + -1;
        dest_local = dest_local + 1;
      } while (0 < n);
      break;
    case 1:
      goto switchD_00b7e21d_caseD_1;
    case 2:
      goto switchD_00b7e21d_caseD_2;
    case 3:
      goto switchD_00b7e21d_caseD_3;
    case 4:
      goto switchD_00b7e21d_caseD_4;
    case 5:
      goto switchD_00b7e21d_caseD_5;
    case 6:
      goto switchD_00b7e21d_caseD_6;
    case 7:
      goto switchD_00b7e21d_caseD_7;
    }
  }
  return;
}

Assistant:

inline void qt_memfill_template(T *dest, T color, qsizetype count)
{
    if (!count)
        return;

    qsizetype n = (count + 7) / 8;
    switch (count & 0x07)
    {
    case 0: do { *dest++ = color; Q_FALLTHROUGH();
    case 7:      *dest++ = color; Q_FALLTHROUGH();
    case 6:      *dest++ = color; Q_FALLTHROUGH();
    case 5:      *dest++ = color; Q_FALLTHROUGH();
    case 4:      *dest++ = color; Q_FALLTHROUGH();
    case 3:      *dest++ = color; Q_FALLTHROUGH();
    case 2:      *dest++ = color; Q_FALLTHROUGH();
    case 1:      *dest++ = color;
    } while (--n > 0);
    }
}